

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O2

bool __thiscall
google::protobuf::SimpleDescriptorDatabase::
DescriptorIndex<const_google::protobuf::FileDescriptorProto_*>::AddNestedExtensions
          (DescriptorIndex<const_google::protobuf::FileDescriptorProto_*> *this,string *filename,
          DescriptorProto *message_type,FileDescriptorProto *value)

{
  int iVar1;
  bool bVar2;
  bool bVar3;
  Type *message_type_00;
  Type *field;
  int i;
  int iVar4;
  int i_1;
  
  iVar4 = 0;
  do {
    if ((message_type->nested_type_).super_RepeatedPtrFieldBase.current_size_ <= iVar4) {
      iVar4 = 0;
      do {
        iVar1 = (message_type->extension_).super_RepeatedPtrFieldBase.current_size_;
        bVar2 = iVar1 <= iVar4;
        if (iVar1 <= iVar4) {
          return bVar2;
        }
        field = internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<google::protobuf::FieldDescriptorProto>::TypeHandler>
                          (&(message_type->extension_).super_RepeatedPtrFieldBase,iVar4);
        bVar3 = AddExtension(this,filename,field,value);
        iVar4 = iVar4 + 1;
      } while (bVar3);
      return bVar2;
    }
    message_type_00 =
         internal::RepeatedPtrFieldBase::
         Get<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto>::TypeHandler>
                   (&(message_type->nested_type_).super_RepeatedPtrFieldBase,iVar4);
    bVar2 = AddNestedExtensions(this,filename,message_type_00,value);
    iVar4 = iVar4 + 1;
  } while (bVar2);
  return false;
}

Assistant:

bool SimpleDescriptorDatabase::DescriptorIndex<Value>::AddNestedExtensions(
    const std::string& filename, const DescriptorProto& message_type,
    Value value) {
  for (int i = 0; i < message_type.nested_type_size(); i++) {
    if (!AddNestedExtensions(filename, message_type.nested_type(i), value))
      return false;
  }
  for (int i = 0; i < message_type.extension_size(); i++) {
    if (!AddExtension(filename, message_type.extension(i), value)) return false;
  }
  return true;
}